

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAngle.cpp
# Opt level: O3

void test_qclab_QAngle<float>(void)

{
  double unaff_RBX;
  char *pcVar1;
  double unaff_retaddr;
  double in_stack_00000008;
  AssertionResult gtest_ar;
  float sin;
  float cos;
  char *in_stack_ffffffffffffffc8;
  float fVar2;
  undefined4 in_stack_ffffffffffffffd4;
  AssertHelper local_28;
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  float local_10;
  float local_c;
  
  fVar2 = 1.0;
  local_28.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<float,int>
            (local_20,"angle.cos()","1",(float *)&stack0xffffffffffffffd0,(int *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xd,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  fVar2 = 0.0;
  local_28.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<float,int>
            (local_20,"angle.sin()","0",(float *)&stack0xffffffffffffffd0,(int *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xe,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  fVar2 = 0.0;
  local_28.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<float,int>
            (local_20,"angle.theta()","0",(float *)&stack0xffffffffffffffd0,(int *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x14,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x15,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x16,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  fVar2 = -4.371139e-08;
  local_28.data_._0_4_ = 0xb33bbd2e;
  testing::internal::CmpHelperEQ<float,float>
            (local_20,"angle.cos()","std::cos( pi/2 )",(float *)&stack0xffffffffffffffd0,
             (float *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x1a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  fVar2 = 1.0;
  local_28.data_._0_4_ = 0x3f800000;
  testing::internal::CmpHelperEQ<float,float>
            (local_20,"angle.sin()","std::sin( pi/2 )",(float *)&stack0xffffffffffffffd0,
             (float *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x1b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x1c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  fVar2 = 0.49999997;
  local_28.data_._0_4_ = 0x3effffff;
  testing::internal::CmpHelperEQ<float,float>
            (local_20,"angle.cos()","std::cos( pi/3 )",(float *)&stack0xffffffffffffffd0,
             (float *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x20,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  fVar2 = 0.86602545;
  local_28.data_._0_4_ = 0x3f5db3d8;
  testing::internal::CmpHelperEQ<float,float>
            (local_20,"angle.sin()","std::sin( pi/3 )",(float *)&stack0xffffffffffffffd0,
             (float *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x21,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x22,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x32,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x33,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x34,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x3d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x3e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x3f,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x48,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x49,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x4a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  local_c = 0.70710677;
  local_10 = 0.70710677;
  fVar2 = 0.70710677;
  testing::internal::CmpHelperEQ<float,float>
            (local_20,"angle.cos()","cos",(float *)&stack0xffffffffffffffd0,&local_c);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x53,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  fVar2 = 0.70710677;
  testing::internal::CmpHelperEQ<float,float>
            (local_20,"angle.sin()","sin",(float *)&stack0xffffffffffffffd0,&local_10);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x54,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x55,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x68,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x69,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x6d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x80,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x81,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x82,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x83,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x84,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x85,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x98,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x99,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0x9a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xa1,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xa2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xa3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xaf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb0,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb1,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb2,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb3,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  testing::internal::DoubleNearPredFormat
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,fVar2),in_stack_ffffffffffffffc8,
             (char *)in_stack_ffffffffffffffe8,in_stack_00000008,unaff_retaddr,unaff_RBX);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd0);
    if (in_stack_ffffffffffffffe8 ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (in_stack_ffffffffffffffe8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/QAngle.cpp"
               ,0xb4,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&stack0xffffffffffffffd0);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffd4,fVar2) + 8))();
    }
  }
  if (in_stack_ffffffffffffffe8 !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&stack0xffffffffffffffe8,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void test_qclab_QAngle() {

  const T pi = 4 * std::atan(1) ;
  const T tol = 10 * std::numeric_limits< T >::epsilon() ;

  {
    qclab::QAngle< T >  angle ;

    EXPECT_EQ( angle.cos() , 1 ) ;    // cos
    EXPECT_EQ( angle.sin() , 0 ) ;    // sin
    EXPECT_EQ( angle.theta() , 0 ) ;  // theta

    // update(angle)
    qclab::QAngle< T >  new_angle( 1 ) ;
    angle.update( new_angle ) ;
    EXPECT_NEAR( angle.cos() , std::cos( 1 ) , tol ) ;
    EXPECT_NEAR( angle.sin() , std::sin( 1 ) , tol ) ;
    EXPECT_NEAR( angle.theta() , 1 , tol ) ;

    // update(theta)
    angle.update( pi/2 ) ;
    EXPECT_EQ( angle.cos() , std::cos( pi/2 ) ) ;
    EXPECT_EQ( angle.sin() , std::sin( pi/2 ) ) ;
    EXPECT_NEAR( angle.theta() , pi/2 , tol ) ;

    // update(cos,sin)
    angle.update( std::cos( pi/3 ) , std::sin( pi/3 ) ) ;
    EXPECT_EQ( angle.cos() , std::cos( pi/3 ) ) ;
    EXPECT_EQ( angle.sin() , std::sin( pi/3 ) ) ;
    EXPECT_NEAR( angle.theta() , pi/3 , tol ) ;

    // operators == and !=
    EXPECT_TRUE( angle != new_angle ) ;
    EXPECT_FALSE( angle == new_angle ) ;
    new_angle.update( angle ) ;
    EXPECT_TRUE( angle == new_angle ) ;
    EXPECT_FALSE( angle != new_angle ) ;
  }

  {
    const T theta = 1 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( theta ) ;

    EXPECT_NEAR( angle.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( angle.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = pi/2 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( theta ) ;

    EXPECT_NEAR( angle.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( angle.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = 0.5 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( cos , sin ) ;

    EXPECT_NEAR( angle.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( angle.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = pi/4 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle( cos , sin ) ;

    EXPECT_EQ( angle.cos() , cos ) ;              // cos
    EXPECT_EQ( angle.sin() , sin ) ;              // sin
    EXPECT_NEAR( angle.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const T cos1 = std::cos( theta1 ) ;
    const T sin1 = std::sin( theta1 ) ;
    qclab::QAngle< T >  angle1( theta1 ) ;

    const T theta2 = pi/3 ;
    const T cos2 = std::cos( theta2 ) ;
    const T sin2 = std::sin( theta2 ) ;
    qclab::QAngle< T >  angle2( theta2 ) ;

    // operator +=
    angle1 += angle2 ;
    T theta = theta1 + theta2 ;
    T cos = std::cos( theta ) ;
    T sin = std::sin( theta ) ;
    EXPECT_NEAR( angle1.cos() , cos , tol ) ;       // cos
    EXPECT_NEAR( angle1.sin() , sin , tol ) ;       // sin
    EXPECT_NEAR( angle1.theta() , theta , tol ) ;   // theta
    EXPECT_NEAR( angle2.cos() , cos2 , tol ) ;      // cos
    EXPECT_NEAR( angle2.sin() , sin2 , tol ) ;      // sin
    EXPECT_NEAR( angle2.theta() , theta2 , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const T cos1 = std::cos( theta1 ) ;
    const T sin1 = std::sin( theta1 ) ;
    qclab::QAngle< T >  angle1( theta1 ) ;

    const T theta2 = pi/3 ;
    const T cos2 = std::cos( theta2 ) ;
    const T sin2 = std::sin( theta2 ) ;
    qclab::QAngle< T >  angle2( theta2 ) ;

    // operator -=
    angle1 -= angle2 ;
    T theta = theta1 - theta2 ;
    T cos = std::cos( theta ) ;
    T sin = std::sin( theta ) ;
    EXPECT_NEAR( angle1.cos() , cos , tol ) ;       // cos
    EXPECT_NEAR( angle1.sin() , sin , tol ) ;       // sin
    EXPECT_NEAR( angle1.theta() , theta , tol ) ;   // theta
    EXPECT_NEAR( angle2.cos() , cos2 , tol ) ;      // cos
    EXPECT_NEAR( angle2.sin() , sin2 , tol ) ;      // sin
    EXPECT_NEAR( angle2.theta() , theta2 , tol ) ;  // theta
  }

  {
    const T theta1 = pi/2 ;
    const T cos1 = std::cos( theta1 ) ;
    const T sin1 = std::sin( theta1 ) ;
    qclab::QAngle< T >  angle1( theta1 ) ;

    const T theta2 = pi/3 ;
    const T cos2 = std::cos( theta2 ) ;
    const T sin2 = std::sin( theta2 ) ;
    qclab::QAngle< T >  angle2( theta2 ) ;

    // operator +
    qclab::QAngle< T > sum = angle1 + angle2 ;
    T theta = theta1 + theta2 ;
    T cos = std::cos( theta ) ;
    T sin = std::sin( theta ) ;
    EXPECT_NEAR( sum.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( sum.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( sum.theta() , theta , tol ) ;  // theta

    // operator -
    qclab::QAngle< T > minus = angle1 - angle2 ;
    theta = theta1 - theta2 ;
    cos = std::cos( theta ) ;
    sin = std::sin( theta ) ;
    EXPECT_NEAR( minus.cos() , cos , tol ) ;      // cos
    EXPECT_NEAR( minus.sin() , sin , tol ) ;      // sin
    EXPECT_NEAR( minus.theta() , theta , tol ) ;  // theta
  }

  {
    const T theta = 1 ;
    const T cos = std::cos( theta ) ;
    const T sin = std::sin( theta ) ;
    qclab::QAngle< T >  angle1( theta ) ;
    qclab::QAngle< T >  angle2 ;

    // operator -
    angle2 = -angle1 ;
    EXPECT_NEAR( angle1.cos() ,  cos , tol ) ;      // cos
    EXPECT_NEAR( angle1.sin() , sin , tol ) ;       // sin
    EXPECT_NEAR( angle1.theta() , theta , tol ) ;   // theta
    EXPECT_NEAR( angle2.cos() ,  cos , tol ) ;      // cos
    EXPECT_NEAR( angle2.sin() , -sin , tol ) ;      // sin
    EXPECT_NEAR( angle2.theta() , -theta , tol ) ;  // theta
  }

}